

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popthelp.c
# Opt level: O2

void poptPrintHelp(poptContext con,FILE *fp,wchar_t flags)

{
  columns_t columns;
  size_t sVar1;
  char *pcVar2;
  char *translation_domain;
  
  columns = (columns_t)calloc(1,0x10);
  showHelpIntro(con,fp);
  pcVar2 = "[OPTION...]";
  if (con->otherHelp != (char *)0x0) {
    pcVar2 = con->otherHelp;
  }
  translation_domain = " %s\n";
  POPT_fprintf(fp," %s\n",pcVar2);
  if (columns != (columns_t)0x0) {
    sVar1 = maxArgWidth(con->options,translation_domain);
    columns->cur = sVar1;
    sVar1 = maxColumnWidth(fp);
    columns->max = sVar1;
    singleTableHelp(con,fp,con->options,columns,(char *)0x0);
    free(columns);
    return;
  }
  return;
}

Assistant:

void poptPrintHelp(poptContext con, FILE * fp, UNUSED(int flags))
{
    columns_t columns = calloc((size_t)1, sizeof(*columns));

    (void) showHelpIntro(con, fp);
    if (con->otherHelp)
	POPT_fprintf(fp, " %s\n", con->otherHelp);
    else
	POPT_fprintf(fp, " %s\n", POPT_("[OPTION...]"));

    if (columns) {
	columns->cur = maxArgWidth(con->options, NULL);
	columns->max = maxColumnWidth(fp);
	singleTableHelp(con, fp, con->options, columns, NULL);
	free(columns);
    }
}